

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

unsigned_short chaiscript::bootstrap::parse_string<unsigned_short>(string *i)

{
  _Ios_Openmode _Var1;
  unsigned_short local_19a;
  stringstream local_198 [6];
  unsigned_short t;
  stringstream ss;
  string *i_local;
  
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,(string *)i,_Var1);
  std::istream::operator>>((istream *)local_198,&local_19a);
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_19a;
}

Assistant:

Input parse_string(const std::string &i) {
    if constexpr (!std::is_same<Input, wchar_t>::value && !std::is_same<Input, char16_t>::value && !std::is_same<Input, char32_t>::value) {
      std::stringstream ss(i);
      Input t;
      ss >> t;
      return t;
    } else {
      throw std::runtime_error("Parsing of wide characters is not yet supported");
    }
  }